

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::CheckOpcode1(TypeChecker *this,Opcode opcode)

{
  Result RVar1;
  Info local_58;
  Opcode local_2c [2];
  Opcode opcode_local;
  
  local_2c[0].enum_ = opcode.enum_;
  Opcode::GetInfo(&local_58,local_2c);
  Opcode::GetInfo(&local_58,local_2c);
  RVar1 = PopAndCheck1Type(this,local_58.param1_type,local_58.name);
  Opcode::GetInfo(&local_58,local_2c);
  PushType(this,local_58.result_type);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode1(Opcode opcode) {
  Result result = PopAndCheck1Type(opcode.GetParamType1(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}